

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManOneHot(int nSkips,int nVars)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iLit0;
  int iVar5;
  uint *__ptr;
  Gia_Man_t *p;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  int nObjsMax;
  size_t __nmemb;
  int iVar9;
  long lVar10;
  
  iVar9 = nVars;
  if (1 < (uint)nVars) {
    uVar4 = nVars - 1;
    if (uVar4 == 0) {
      iVar9 = 0;
    }
    else {
      uVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      iVar9 = (uVar3 ^ 0xffffffe0) + 0x21;
    }
  }
  __nmemb = (size_t)(1 << ((byte)iVar9 & 0x1f));
  __ptr = (uint *)calloc(__nmemb,4);
  nObjsMax = nSkips + 1 + nVars * 4;
  p = Gia_ManStart(nObjsMax);
  pcVar6 = (char *)malloc(7);
  builtin_strncpy(pcVar6,"onehot",7);
  p->pName = pcVar6;
  if (0 < nSkips) {
    do {
      pGVar7 = Gia_ManAppendObj(p);
      uVar8 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p->pObjs;
      if ((pGVar7 < pGVar1) || (pGVar1 + p->nObjs <= pGVar7)) goto LAB_001eefb0;
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar1) >> 2) * -0x55555555);
      if ((pGVar7 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar7)) goto LAB_001eefb0;
      nSkips = nSkips + -1;
    } while (nSkips != 0);
  }
  if (0 < nVars) {
    uVar8 = 0;
    do {
      pGVar7 = Gia_ManAppendObj(p);
      uVar2 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p->pObjs;
      if ((pGVar7 < pGVar1) || (pGVar1 + p->nObjs <= pGVar7)) {
LAB_001eefb0:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p->pObjs;
      if ((pGVar7 < pGVar1) || (pGVar1 + p->nObjs <= pGVar7)) goto LAB_001eefb0;
      __ptr[uVar8] = (int)((ulong)((long)pGVar7 - (long)pGVar1) >> 2) * 0x55555556;
      uVar8 = uVar8 + 1;
    } while ((uint)nVars != uVar8);
  }
  Gia_ManHashStart(p);
  if (iVar9 != 0) {
    iVar5 = 0;
    do {
      if (iVar9 != 0x1f) {
        lVar10 = 0;
        do {
          uVar4 = __ptr[lVar10];
          uVar3 = __ptr[(1 << ((byte)iVar5 & 0x1f)) + lVar10];
          iLit0 = Gia_ManHashAnd(p,uVar4,uVar3);
          if (iLit0 != 0) {
            Gia_ManAppendCo(p,iLit0);
          }
          uVar4 = Gia_ManHashOr(p,uVar4,uVar3);
          __ptr[lVar10] = uVar4;
          lVar10 = lVar10 + (2 << ((byte)iVar5 & 0x1f));
        } while (lVar10 < (long)__nmemb);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar9);
  }
  Gia_ManHashStop(p);
  if ((int)*__ptr < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x131,"int Abc_LitNot(int)");
  }
  Gia_ManAppendCo(p,*__ptr ^ 1);
  free(__ptr);
  if (nObjsMax < p->nObjs) {
    __assert_fail("Gia_ManObjNum(p) <= nSkips + 4 * nVars + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xe47,"Gia_Man_t *Gia_ManOneHot(int, int)");
  }
  return p;
}

Assistant:

Gia_Man_t * Gia_ManOneHot( int nSkips, int nVars )
{
    Gia_Man_t * p;
    int i, b, Shift, iGiaLit, nLogVars = Abc_Base2Log( nVars );
    int * pTemp = ABC_CALLOC( int, (1 << nLogVars) );
    p = Gia_ManStart( nSkips + 4 * nVars + 1 );
    p->pName = Abc_UtilStrsav( "onehot" );
    for ( i = 0; i < nSkips; i++ )
        Gia_ManAppendCi( p );
    for ( i = 0; i < nVars; i++ )
        pTemp[i] = Gia_ManAppendCi( p );
    Gia_ManHashStart( p );
    for ( b = 0; b < nLogVars; b++ )
        for ( i = 0, Shift = (1<<b); i < (1 << nLogVars); i += 2*Shift )
        {
            iGiaLit = Gia_ManHashAnd( p, pTemp[i], pTemp[i + Shift] );
            if ( iGiaLit )
                Gia_ManAppendCo( p, iGiaLit );
            pTemp[i] = Gia_ManHashOr( p, pTemp[i], pTemp[i + Shift] );
        }
    Gia_ManHashStop( p );
    Gia_ManAppendCo( p, Abc_LitNot(pTemp[0]) );
    ABC_FREE( pTemp );
    assert( Gia_ManObjNum(p) <= nSkips + 4 * nVars + 1 );
    return p;
}